

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall llama_vocab::impl::impl(impl *this,llama_vocab *vocab)

{
  _Rb_tree_header *p_Var1;
  
  this->n_token_types = 0;
  this->type = LLAMA_VOCAB_TYPE_SPM;
  this->pre_type = LLAMA_VOCAB_PRE_TYPE_DEFAULT;
  this->max_token_len = 0;
  this->special_bos_id = 1;
  this->special_eos_id = 2;
  this->special_eot_id = -1;
  this->special_eom_id = -1;
  this->special_unk_id = 0;
  this->special_sep_id = -1;
  this->special_pad_id = -1;
  this->special_mask_id = -1;
  this->linefeed_id = 0xd;
  this->special_fim_pre_id = -1;
  this->special_fim_suf_id = -1;
  this->special_fim_mid_id = -1;
  this->special_fim_pad_id = -1;
  this->special_fim_rep_id = -1;
  this->special_fim_sep_id = -1;
  this->add_space_prefix = false;
  this->add_bos = false;
  this->add_eos = false;
  this->ignore_merges = false;
  this->clean_spaces = false;
  this->remove_extra_whitespaces = false;
  this->escape_whitespaces = true;
  this->treat_whitespace_as_suffix = false;
  (this->token_to_id)._M_h._M_buckets = &(this->token_to_id)._M_h._M_single_bucket;
  (this->token_to_id)._M_h._M_bucket_count = 1;
  (this->token_to_id)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->token_to_id)._M_h._M_element_count = 0;
  (this->token_to_id)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->token_to_id)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->id_to_token).
  super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->id_to_token).
  super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->id_to_token).
    super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->cache_special_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cache_special_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cache_token_to_piece).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cache_token_to_piece).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cache_token_to_piece).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bpe_ranks)._M_h._M_buckets = &(this->bpe_ranks)._M_h._M_single_bucket;
  (this->bpe_ranks)._M_h._M_bucket_count = 1;
  (this->bpe_ranks)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->bpe_ranks)._M_h._M_element_count = 0;
  (this->bpe_ranks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->bpe_ranks)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  p_Var1 = &(this->special_eog_ids)._M_t._M_impl.super__Rb_tree_header;
  (this->special_eog_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->special_eog_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->special_eog_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->special_eog_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->precompiled_charsmap).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->precompiled_charsmap).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->precompiled_charsmap).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])&(this->special_eog_ids)._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  this->vocab = vocab;
  return;
}

Assistant:

impl(const llama_vocab & vocab) : vocab(vocab) {
    }